

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSimpleUpdater.cpp
# Opt level: O1

void QSimpleUpdater::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  QString *pQVar5;
  Updater *pUVar6;
  int iVar7;
  void *local_28;
  void *local_20;
  void *pvStack_18;
  
  if (_c == IndexOfMethod) {
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == checkingFinished && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == appcastDownloaded && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == downloadFinished && lVar4 == 0) {
      *puVar2 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_20 = _a[1];
      iVar7 = 0;
      break;
    case 1:
      local_20 = _a[1];
      pvStack_18 = _a[2];
      iVar7 = 1;
      break;
    case 2:
      local_20 = _a[1];
      pvStack_18 = _a[2];
      iVar7 = 2;
      break;
    case 3:
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::checkForUpdates(pUVar6);
      return;
    case 4:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setDownloadDir(pUVar6,pQVar5);
      return;
    case 5:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setModuleName(pUVar6,pQVar5);
      return;
    case 6:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setNotifyOnUpdate(pUVar6,bVar1);
      return;
    case 7:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setNotifyOnFinish(pUVar6,bVar1);
      return;
    case 8:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setPlatformKey(pUVar6,pQVar5);
      return;
    case 9:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setModuleVersion(pUVar6,pQVar5);
      return;
    case 10:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setDownloaderEnabled(pUVar6,bVar1);
      return;
    case 0xb:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setUserAgentString(pUVar6,pQVar5);
      return;
    case 0xc:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setUseCustomAppcast(pUVar6,bVar1);
      return;
    case 0xd:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setUseCustomInstallProcedures(pUVar6,bVar1);
      return;
    case 0xe:
      bVar1 = *_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setMandatoryUpdate(pUVar6,bVar1);
      return;
    case 0xf:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setDownloadUserName(pUVar6,pQVar5);
      return;
    case 0x10:
      pQVar5 = (QString *)_a[2];
      pUVar6 = getUpdater((QSimpleUpdater *)_o,(QString *)_a[1]);
      Updater::setDownloadPassword(pUVar6,pQVar5);
      return;
    default:
      goto switchD_0010dfaf_default;
    }
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_28);
  }
switchD_0010dfaf_default:
  return;
}

Assistant:

void QSimpleUpdater::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSimpleUpdater *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->checkingFinished((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->appcastDownloaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->downloadFinished((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->checkForUpdates((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->setDownloadDir((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 5: _t->setModuleName((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 6: _t->setNotifyOnUpdate((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 7: _t->setNotifyOnFinish((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 8: _t->setPlatformKey((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 9: _t->setModuleVersion((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->setDownloaderEnabled((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 11: _t->setUserAgentString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 12: _t->setUseCustomAppcast((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 13: _t->setUseCustomInstallProcedures((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 14: _t->setMandatoryUpdate((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<bool>>(_a[2]))); break;
        case 15: _t->setDownloadUserName((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 16: _t->setDownloadPassword((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSimpleUpdater::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::checkingFinished)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QSimpleUpdater::*)(const QString & , const QByteArray & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::appcastDownloaded)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (QSimpleUpdater::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSimpleUpdater::downloadFinished)) {
                *result = 2;
                return;
            }
        }
    }
}